

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O3

void __thiscall Nes_Dmc::recalc_irq(Nes_Dmc *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x40000000;
  if ((this->irq_enabled == true) && (iVar1 = (this->super_Nes_Osc).length_counter, iVar1 != 0)) {
    iVar2 = this->apu->last_dmc_time + (this->super_Nes_Osc).delay +
            (this->bits_remain + iVar1 * 8 + -9) * this->period + 1;
  }
  if (iVar2 == this->next_irq) {
    return;
  }
  this->next_irq = iVar2;
  Nes_Apu::irq_changed(this->apu);
  return;
}

Assistant:

void Nes_Dmc::recalc_irq()
{
	nes_time_t irq = Nes_Apu::no_irq;
	if ( irq_enabled && length_counter )
		irq = apu->last_dmc_time + delay +
				((length_counter - 1) * 8 + bits_remain - 1) * nes_time_t (period) + 1;
	if ( irq != next_irq ) {
		next_irq = irq;
		apu->irq_changed();
	}
}